

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.h
# Opt level: O0

void __thiscall
slang::ast::Delay3Control::visitExprs<slang::ast::builtins::SequenceMethodExprVisitor&>
          (Delay3Control *this,SequenceMethodExprVisitor *visitor)

{
  Expression *in_RSI;
  SequenceMethodExprVisitor *in_RDI;
  
  Expression::visit<slang::ast::builtins::SequenceMethodExprVisitor&>(in_RSI,in_RDI);
  if (in_RDI[1].context != (ASTContext *)0x0) {
    Expression::visit<slang::ast::builtins::SequenceMethodExprVisitor&>(in_RSI,in_RDI);
  }
  if (in_RDI[1].name._M_dataplus._M_p != (pointer)0x0) {
    Expression::visit<slang::ast::builtins::SequenceMethodExprVisitor&>(in_RSI,in_RDI);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        expr1.visit(visitor);
        if (expr2)
            expr2->visit(visitor);
        if (expr3)
            expr3->visit(visitor);
    }